

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O2

int coda_mem_cursor_read_uint16_partial_array
              (coda_cursor *cursor,long offset,long length,uint16_t *dst)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  code *read_basic_type_function;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  cVar1 = pcVar2[1].backend;
  if (cVar1 == coda_backend_binary) {
    read_basic_type_function = coda_cursor_read_uint16;
  }
  else {
    if (cVar1 != 2) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x41b,
                    "int coda_mem_cursor_read_uint16_partial_array(const coda_cursor *, long, long, uint16_t *)"
                   );
    }
    iVar3 = **(int **)(pcVar2->definition + 1);
    if (iVar3 == 0) {
      read_basic_type_function = coda_ascii_cursor_read_uint16;
    }
    else {
      if (iVar3 != 1) {
        __assert_fail("((coda_type_array *)type->definition)->base_type->format == coda_format_ascii"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                      ,0x421,
                      "int coda_mem_cursor_read_uint16_partial_array(const coda_cursor *, long, long, uint16_t *)"
                     );
      }
      read_basic_type_function = coda_bin_cursor_read_uint16;
    }
  }
  iVar3 = read_partial_array(cursor,read_basic_type_function,offset,length,(uint8_t *)dst,2);
  return iVar3;
}

Assistant:

int coda_mem_cursor_read_uint16_partial_array(const coda_cursor *cursor, long offset, long length, uint16_t *dst)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_array)
    {
        return read_partial_array(cursor, (read_function)&coda_cursor_read_uint16, offset, length, (uint8_t *)dst,
                                  sizeof(uint16_t));
    }
    assert(type->tag == tag_mem_data);
    if (((coda_type_array *)type->definition)->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_uint16, offset, length, (uint8_t *)dst,
                                  sizeof(uint16_t));
    }
    assert(((coda_type_array *)type->definition)->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_uint16, offset, length, (uint8_t *)dst,
                              sizeof(uint16_t));
}